

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

size_t __thiscall
kj::anon_unknown_8::DiskHandle::copyChunk
          (DiskHandle *this,uint64_t offset,int fromFd,uint64_t fromOffset,uint64_t size)

{
  char *pcVar1;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  ArrayPtr<unsigned_char> local_1128;
  ArrayPtr<const_unsigned_char> local_1118;
  Fault local_1108;
  Fault f_2;
  SyscallResult local_10d4;
  undefined1 auStack_10d0 [4];
  SyscallResult _kjSyscallResult_1;
  ssize_t n_1;
  byte buffer [4096];
  uint64_t total;
  Fault f_1;
  undefined1 auStack_b0 [4];
  int error;
  DiskHandle *local_a8;
  int *local_a0;
  off_t *local_98;
  ssize_t *local_90;
  int local_84;
  long lStack_80;
  int _kjSyscallError;
  ssize_t n;
  off_t end;
  off_t fromPos;
  Fault local_58;
  Fault f;
  SyscallResult local_3c;
  uint64_t uStack_38;
  SyscallResult _kjSyscallResult;
  uint64_t size_local;
  uint64_t fromOffset_local;
  char *pcStack_20;
  int fromFd_local;
  uint64_t offset_local;
  DiskHandle *this_local;
  size_t sVar5;
  
  f.exception = (Exception *)this;
  uStack_38 = size;
  fromOffset_local._4_4_ = fromFd;
  pcStack_20 = (char *)offset;
  offset_local = (uint64_t)this;
  local_3c = _::Debug::
             syscall<kj::(anonymous_namespace)::DiskHandle::copyChunk(unsigned_long,int,unsigned_long,unsigned_long)const::_lambda()_1_>
                       ((anon_class_16_2_4c12348e *)&f,false);
  pvVar3 = _::Debug::SyscallResult::operator_cast_to_void_(&local_3c);
  if (pvVar3 == (void *)0x0) {
    iVar2 = _::Debug::SyscallResult::getErrorNumber(&local_3c);
    _::Debug::Fault::Fault
              (&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x1ed,iVar2,"lseek(fd, offset, SEEK_SET)","");
    _::Debug::Fault::fatal(&local_58);
  }
  n = fromOffset + uStack_38;
  end = fromOffset;
  while (end < n) {
    _auStack_b0 = &stack0xffffffffffffff80;
    local_a0 = (int *)((long)&fromOffset_local + 4);
    local_98 = &end;
    local_90 = &n;
    local_a8 = this;
    f_1.exception._4_4_ =
         _::Debug::
         syscallError<kj::(anonymous_namespace)::DiskHandle::copyChunk(unsigned_long,int,unsigned_long,unsigned_long)const::_lambda()_2_>
                   ((anon_class_40_5_442d3a09 *)auStack_b0,false);
    if (f_1.exception._4_4_ != 0) {
      local_84 = f_1.exception._4_4_;
      if ((f_1.exception._4_4_ != 0x16) && (f_1.exception._4_4_ != 0x26)) {
        _::Debug::Fault::Fault
                  ((Fault *)&total,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x1f7,f_1.exception._4_4_,"sendfile","");
        this_local = (DiskHandle *)(end - fromOffset);
        _::Debug::Fault::~Fault((Fault *)&total);
        return (size_t)this_local;
      }
      buffer[0xff8] = '\0';
      buffer[0xff9] = '\0';
      buffer[0xffa] = '\0';
      buffer[0xffb] = '\0';
      buffer[0xffc] = '\0';
      buffer[0xffd] = '\0';
      buffer[0xffe] = '\0';
      buffer[0xfff] = '\0';
      while( true ) {
        if (uStack_38 == 0) {
          sVar4._0_1_ = buffer[0xff8];
          sVar4._1_1_ = buffer[0xff9];
          sVar4._2_1_ = buffer[0xffa];
          sVar4._3_1_ = buffer[0xffb];
          sVar4._4_1_ = buffer[0xffc];
          sVar4._5_1_ = buffer[0xffd];
          sVar4._6_1_ = buffer[0xffe];
          sVar4._7_1_ = buffer[0xfff];
          return sVar4;
        }
        f_2.exception = (Exception *)auStack_10d0;
        local_10d4 = _::Debug::
                     syscall<kj::(anonymous_namespace)::DiskHandle::copyChunk(unsigned_long,int,unsigned_long,unsigned_long)const::_lambda()_3_>
                               ((anon_class_40_5_374d4c74 *)&f_2,false);
        pvVar3 = _::Debug::SyscallResult::operator_cast_to_void_(&local_10d4);
        pcVar1 = pcStack_20;
        if (pvVar3 == (void *)0x0) break;
        if (_auStack_10d0 == (char *)0x0) {
          sVar5._0_1_ = buffer[0xff8];
          sVar5._1_1_ = buffer[0xff9];
          sVar5._2_1_ = buffer[0xffa];
          sVar5._3_1_ = buffer[0xffb];
          sVar5._4_1_ = buffer[0xffc];
          sVar5._5_1_ = buffer[0xffd];
          sVar5._6_1_ = buffer[0xffe];
          sVar5._7_1_ = buffer[0xfff];
          return sVar5;
        }
        local_1128 = arrayPtr<unsigned_char>((uchar *)&n_1,(size_t)_auStack_10d0);
        local_1118 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_1128);
        write(this,(int)pcVar1,local_1118.ptr,local_1118.size_);
        pcStack_20 = _auStack_10d0 + (long)pcStack_20;
        buffer._4088_8_ = _auStack_10d0 + buffer._4088_8_;
        uStack_38 = uStack_38 - (long)_auStack_10d0;
      }
      iVar2 = _::Debug::SyscallResult::getErrorNumber(&local_10d4);
      _::Debug::Fault::Fault
                (&local_1108,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x204,iVar2,"n = pread(fromFd, buffer, kj::min(sizeof(buffer), size), fromOffset)"
                 ,"");
      _::Debug::Fault::fatal(&local_1108);
    }
    if (lStack_80 == 0) break;
    local_84 = 0;
  }
  return end - fromOffset;
}

Assistant:

size_t copyChunk(uint64_t offset, int fromFd, uint64_t fromOffset, uint64_t size) const {
    // Copies a range of bytes from `fromFd` to this file in the most efficient way possible for
    // the OS. Only returns less than `size` if EOF. Does not account for holes.

#if __linux__
    {
      KJ_SYSCALL(lseek(fd, offset, SEEK_SET));
      off_t fromPos = fromOffset;
      off_t end = fromOffset + size;
      while (fromPos < end) {
        ssize_t n;
        KJ_SYSCALL_HANDLE_ERRORS(n = sendfile(fd, fromFd, &fromPos, end - fromPos)) {
          case EINVAL:
          case ENOSYS:
            goto sendfileNotAvailable;
          default:
            KJ_FAIL_SYSCALL("sendfile", error) { return fromPos - fromOffset; }
        }
        if (n == 0) break;
      }
      return fromPos - fromOffset;
    }

  sendfileNotAvailable:
#endif
    uint64_t total = 0;
    while (size > 0) {
      byte buffer[4096];
      ssize_t n;
      KJ_SYSCALL(n = pread(fromFd, buffer, kj::min(sizeof(buffer), size), fromOffset));
      if (n == 0) break;
      write(offset, arrayPtr(buffer, n));
      fromOffset += n;
      offset += n;
      total += n;
      size -= n;
    }
    return total;
  }